

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::GenerateCTestXML(cmCTestTestHandler *this,cmXMLWriter *xml)

{
  pointer pcVar1;
  char *pcVar2;
  cmCTestTestResult *result;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  cmCTestTestHandler *pcVar5;
  pointer pcVar6;
  string testPath;
  string sStack_d8;
  allocator<char> local_b1;
  cmCTestTestHandler *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  pointer local_88;
  cmCTestTestResult *local_80;
  _Rb_tree_node_base *local_78;
  string local_70;
  string local_50;
  
  bVar3 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar3) {
    cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                      (this->super_cmCTestGenericHandler).AppendXML);
    cmCTest::GenerateSubprojectsOutput((this->super_cmCTestGenericHandler).CTest,xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_d8,"Testing",(allocator<char> *)&local_a8);
    cmXMLWriter::StartElement(xml,&sStack_d8);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_d8,"StartDateTime",(allocator<char> *)&local_a8);
    cmXMLWriter::Element<std::__cxx11::string>(xml,&sStack_d8,&this->StartTest);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_d8,"StartTestTime",(allocator<char> *)&local_a8);
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (xml,&sStack_d8,&this->StartTestTime);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_d8,"TestList",(allocator<char> *)&local_a8);
    cmXMLWriter::StartElement(xml,&sStack_d8);
    std::__cxx11::string::~string((string *)&sStack_d8);
    pcVar1 = (this->TestResults).
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_b0 = this;
    for (pcVar6 = (this->TestResults).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                  ._M_impl.super__Vector_impl_data._M_start; pcVar6 != pcVar1; pcVar6 = pcVar6 + 1)
    {
      std::operator+(&local_a8,&pcVar6->Path,"/");
      std::operator+(&sStack_d8,&local_a8,&pcVar6->Name);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Test",&local_b1);
      cmCTest::GetShortPathToFile
                (&local_70,(local_b0->super_cmCTestGenericHandler).CTest,&sStack_d8);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_a8,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&sStack_d8);
    }
    cmXMLWriter::EndElement(xml);
    local_88 = (local_b0->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pcVar6 = (local_b0->TestResults).
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (pcVar6 != local_88) {
      WriteTestResultHeader(local_b0,xml,pcVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"Results",(allocator<char> *)&local_a8);
      cmXMLWriter::StartElement(xml,&sStack_d8);
      std::__cxx11::string::~string((string *)&sStack_d8);
      if (pcVar6->Status != 0) {
        if ((pcVar6->Status != 9) || (pcVar6->ReturnValue != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_a8);
          cmXMLWriter::StartElement(xml,&sStack_d8);
          std::__cxx11::string::~string((string *)&sStack_d8);
          cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char[10]>(xml,"name",(char (*) [10])"Exit Code");
          pcVar5 = (cmCTestTestHandler *)0x706b7b;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_d8,"Value",(allocator<char> *)&local_70);
          GetTestStatus_abi_cxx11_(&local_a8,pcVar5,pcVar6);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&sStack_d8,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&sStack_d8);
          cmXMLWriter::EndElement(xml);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_a8);
          cmXMLWriter::StartElement(xml,&sStack_d8);
          std::__cxx11::string::~string((string *)&sStack_d8);
          cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char[11]>(xml,"name",(char (*) [11])"Exit Value");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_d8,"Value",(allocator<char> *)&local_a8);
          cmXMLWriter::Element<long>(xml,&sStack_d8,&pcVar6->ReturnValue);
          std::__cxx11::string::~string((string *)&sStack_d8);
          cmXMLWriter::EndElement(xml);
        }
        std::__cxx11::string::string((string *)&local_50,(string *)&pcVar6->TestMeasurementsOutput);
        RecordCustomTestMeasurements(local_b0,xml,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_a8);
        cmXMLWriter::StartElement(xml,&sStack_d8);
        std::__cxx11::string::~string((string *)&sStack_d8);
        cmXMLWriter::Attribute<char[15]>(xml,"type",(char (*) [15])"numeric/double");
        cmXMLWriter::Attribute<char[15]>(xml,"name",(char (*) [15])"Execution Time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_d8,"Value",(allocator<char> *)&local_70);
        local_a8._M_dataplus._M_p = (pointer)(pcVar6->ExecutionTime).__r;
        cmXMLWriter::Element<double>(xml,&sStack_d8,(double *)&local_a8);
        std::__cxx11::string::~string((string *)&sStack_d8);
        cmXMLWriter::EndElement(xml);
        if ((pcVar6->Reason)._M_string_length != 0) {
          pcVar2 = "Test Fail Reason";
          if (pcVar6->Status == 9) {
            pcVar2 = "Test Pass Reason";
          }
          local_a8._M_dataplus._M_p = pcVar2 + 5;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_70);
          cmXMLWriter::StartElement(xml,&sStack_d8);
          std::__cxx11::string::~string((string *)&sStack_d8);
          cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char_const*>(xml,"name",(char **)&local_a8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_d8,"Value",(allocator<char> *)&local_70);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&sStack_d8,&pcVar6->Reason);
          std::__cxx11::string::~string((string *)&sStack_d8);
          cmXMLWriter::EndElement(xml);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_a8);
      cmXMLWriter::StartElement(xml,&sStack_d8);
      std::__cxx11::string::~string((string *)&sStack_d8);
      cmXMLWriter::Attribute<char[15]>(xml,"type",(char (*) [15])"numeric/double");
      cmXMLWriter::Attribute<char[11]>(xml,"name",(char (*) [11])"Processors");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"Value",(allocator<char> *)&local_a8);
      cmXMLWriter::Element<int>(xml,&sStack_d8,&pcVar6->Properties->Processors);
      std::__cxx11::string::~string((string *)&sStack_d8);
      cmXMLWriter::EndElement(xml);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_a8);
      cmXMLWriter::StartElement(xml,&sStack_d8);
      std::__cxx11::string::~string((string *)&sStack_d8);
      cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
      cmXMLWriter::Attribute<char[18]>(xml,"name",(char (*) [18])"Completion Status");
      if ((pcVar6->CustomCompletionStatus)._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_d8,"Value",(allocator<char> *)&local_a8);
        cmXMLWriter::Element<std::__cxx11::string>(xml,&sStack_d8,&pcVar6->CompletionStatus);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_d8,"Value",(allocator<char> *)&local_a8);
        cmXMLWriter::Element<std::__cxx11::string>(xml,&sStack_d8,&pcVar6->CustomCompletionStatus);
      }
      std::__cxx11::string::~string((string *)&sStack_d8);
      cmXMLWriter::EndElement(xml);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_a8);
      cmXMLWriter::StartElement(xml,&sStack_d8);
      std::__cxx11::string::~string((string *)&sStack_d8);
      cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
      cmXMLWriter::Attribute<char[13]>(xml,"name",(char (*) [13])"Command Line");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"Value",(allocator<char> *)&local_a8);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&sStack_d8,&pcVar6->FullCommandLine);
      std::__cxx11::string::~string((string *)&sStack_d8);
      cmXMLWriter::EndElement(xml);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_a8);
      cmXMLWriter::StartElement(xml,&sStack_d8);
      std::__cxx11::string::~string((string *)&sStack_d8);
      cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
      cmXMLWriter::Attribute<char[12]>(xml,"name",(char (*) [12])0x717cf4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"Value",(allocator<char> *)&local_a8);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&sStack_d8,&pcVar6->Environment);
      std::__cxx11::string::~string((string *)&sStack_d8);
      cmXMLWriter::EndElement(xml);
      local_78 = &(pcVar6->Properties->Measurements)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_80 = pcVar6;
      for (p_Var4 = (pcVar6->Properties->Measurements)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left; result = local_80, p_Var4 != local_78;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_d8,"NamedMeasurement",(allocator<char> *)&local_a8);
        cmXMLWriter::StartElement(xml,&sStack_d8);
        std::__cxx11::string::~string((string *)&sStack_d8);
        cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,"name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                  );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_d8,"Value",(allocator<char> *)&local_a8);
        cmXMLWriter::Element<std::__cxx11::string>
                  (xml,&sStack_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 2)
                  );
        std::__cxx11::string::~string((string *)&sStack_d8);
        cmXMLWriter::EndElement(xml);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"Measurement",(allocator<char> *)&local_a8);
      cmXMLWriter::StartElement(xml,&sStack_d8);
      std::__cxx11::string::~string((string *)&sStack_d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_d8,"Value",(allocator<char> *)&local_a8);
      cmXMLWriter::StartElement(xml,&sStack_d8);
      std::__cxx11::string::~string((string *)&sStack_d8);
      if (result->CompressOutput == true) {
        cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
        cmXMLWriter::Attribute<char[5]>(xml,"compression",(char (*) [5])0x77e221);
      }
      cmXMLWriter::Content<std::__cxx11::string>(xml,&result->Output);
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      pcVar5 = local_b0;
      AttachFiles(local_b0,xml,result);
      WriteTestResultFooter(pcVar5,xml,result);
      pcVar6 = result + 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_d8,"EndDateTime",(allocator<char> *)&local_a8);
    pcVar5 = local_b0;
    cmXMLWriter::Element<std::__cxx11::string>(xml,&sStack_d8,&local_b0->EndTest);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_d8,"EndTestTime",(allocator<char> *)&local_a8);
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (xml,&sStack_d8,&pcVar5->EndTestTime);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_d8,"ElapsedMinutes",(allocator<char> *)&local_70);
    local_a8._M_dataplus._M_p = (pointer)(long)((pcVar5->ElapsedTestingTime).__r / 60.0);
    cmXMLWriter::Element<long>(xml,&sStack_d8,(long *)&local_a8);
    std::__cxx11::string::~string((string *)&sStack_d8);
    cmXMLWriter::EndElement(xml);
    cmCTest::EndXML((pcVar5->super_cmCTestGenericHandler).CTest,xml);
  }
  return;
}

Assistant:

void cmCTestTestHandler::GenerateCTestXML(cmXMLWriter& xml)
{
  if (!this->CTest->GetProduceXML()) {
    return;
  }

  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("Testing");
  xml.Element("StartDateTime", this->StartTest);
  xml.Element("StartTestTime", this->StartTestTime);
  xml.StartElement("TestList");
  for (cmCTestTestResult const& result : this->TestResults) {
    std::string testPath = result.Path + "/" + result.Name;
    xml.Element("Test", this->CTest->GetShortPathToFile(testPath));
  }
  xml.EndElement(); // TestList
  for (cmCTestTestResult& result : this->TestResults) {
    this->WriteTestResultHeader(xml, result);
    xml.StartElement("Results");

    if (result.Status != cmCTestTestHandler::NOT_RUN) {
      if (result.Status != cmCTestTestHandler::COMPLETED ||
          result.ReturnValue) {
        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", "Exit Code");
        xml.Element("Value", this->GetTestStatus(result));
        xml.EndElement(); // NamedMeasurement

        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", "Exit Value");
        xml.Element("Value", result.ReturnValue);
        xml.EndElement(); // NamedMeasurement
      }
      this->RecordCustomTestMeasurements(xml, result.TestMeasurementsOutput);
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", "numeric/double");
      xml.Attribute("name", "Execution Time");
      xml.Element("Value", result.ExecutionTime.count());
      xml.EndElement(); // NamedMeasurement
      if (!result.Reason.empty()) {
        const char* reasonType = "Pass Reason";
        if (result.Status != cmCTestTestHandler::COMPLETED) {
          reasonType = "Fail Reason";
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", reasonType);
        xml.Element("Value", result.Reason);
        xml.EndElement(); // NamedMeasurement
      }
    }

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "numeric/double");
    xml.Attribute("name", "Processors");
    xml.Element("Value", result.Properties->Processors);
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Completion Status");
    if (result.CustomCompletionStatus.empty()) {
      xml.Element("Value", result.CompletionStatus);
    } else {
      xml.Element("Value", result.CustomCompletionStatus);
    }
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Command Line");
    xml.Element("Value", result.FullCommandLine);
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Environment");
    xml.Element("Value", result.Environment);
    xml.EndElement(); // NamedMeasurement
    for (auto const& measure : result.Properties->Measurements) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", "text/string");
      xml.Attribute("name", measure.first);
      xml.Element("Value", measure.second);
      xml.EndElement(); // NamedMeasurement
    }
    xml.StartElement("Measurement");
    xml.StartElement("Value");
    if (result.CompressOutput) {
      xml.Attribute("encoding", "base64");
      xml.Attribute("compression", "gzip");
    }
    xml.Content(result.Output);
    xml.EndElement(); // Value
    xml.EndElement(); // Measurement
    xml.EndElement(); // Results

    this->AttachFiles(xml, result);
    this->WriteTestResultFooter(xml, result);
  }

  xml.Element("EndDateTime", this->EndTest);
  xml.Element("EndTestTime", this->EndTestTime);
  xml.Element(
    "ElapsedMinutes",
    std::chrono::duration_cast<std::chrono::minutes>(this->ElapsedTestingTime)
      .count());
  xml.EndElement(); // Testing
  this->CTest->EndXML(xml);
}